

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleUVRowDown2Box_SSSE3(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  bool bVar1;
  undefined1 *puVar2;
  uvec8 auVar3;
  uvec8 auVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar4 = libyuv::kShuffleMergeUV;
  auVar3 = libyuv::kShuffleSplitUV;
  do {
    auVar7 = *(undefined1 (*) [16])src_ptr;
    puVar2 = *(undefined1 (*) [16])src_ptr;
    src_ptr = (uint8_t *)((long)src_ptr + 0x10);
    auVar6 = pshufb(auVar7,(undefined1  [16])auVar3);
    auVar8 = pshufb(*(undefined1 (*) [16])(puVar2 + src_stride),(undefined1  [16])auVar3);
    auVar7[8] = 1;
    auVar7._0_8_ = 0x101010101010101;
    auVar7[9] = 1;
    auVar7[10] = 1;
    auVar7[0xb] = 1;
    auVar7[0xc] = 1;
    auVar7[0xd] = 1;
    auVar7[0xe] = 1;
    auVar7[0xf] = 1;
    auVar7 = pmaddubsw(auVar6,auVar7);
    auVar6[8] = 1;
    auVar6._0_8_ = 0x101010101010101;
    auVar6[9] = 1;
    auVar6[10] = 1;
    auVar6[0xb] = 1;
    auVar6[0xc] = 1;
    auVar6[0xd] = 1;
    auVar6[0xe] = 1;
    auVar6[0xf] = 1;
    auVar6 = pmaddubsw(auVar8,auVar6);
    auVar8._0_2_ = pavgw((ushort)(auVar7._0_2_ + auVar6._0_2_) >> 1,0);
    auVar8._2_2_ = pavgw((ushort)(auVar7._2_2_ + auVar6._2_2_) >> 1,0);
    auVar8._4_2_ = pavgw((ushort)(auVar7._4_2_ + auVar6._4_2_) >> 1,0);
    auVar8._6_2_ = pavgw((ushort)(auVar7._6_2_ + auVar6._6_2_) >> 1,0);
    auVar8._8_2_ = pavgw((ushort)(auVar7._8_2_ + auVar6._8_2_) >> 1,0);
    auVar8._10_2_ = pavgw((ushort)(auVar7._10_2_ + auVar6._10_2_) >> 1,0);
    auVar8._12_2_ = pavgw((ushort)(auVar7._12_2_ + auVar6._12_2_) >> 1,0);
    auVar8._14_2_ = pavgw((ushort)(auVar7._14_2_ + auVar6._14_2_) >> 1,0);
    auVar7 = pshufb(auVar8,(undefined1  [16])auVar4);
    *(long *)dst_ptr = auVar7._0_8_;
    dst_ptr = dst_ptr + 8;
    iVar5 = dst_width + -4;
    bVar1 = 3 < dst_width;
    dst_width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void ScaleUVRowDown2Box_SSSE3(const uint8_t* src_ptr,
                              ptrdiff_t src_stride,
                              uint8_t* dst_ptr,
                              int dst_width) {
  asm volatile(
      "pcmpeqb     %%xmm4,%%xmm4                 \n"  // 01010101
      "psrlw       $0xf,%%xmm4                   \n"
      "packuswb    %%xmm4,%%xmm4                 \n"
      "pxor        %%xmm5, %%xmm5                \n"  // zero
      "movdqa      %4,%%xmm1                     \n"  // split shuffler
      "movdqa      %5,%%xmm3                     \n"  // merge shuffler

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"  // 8 UV row 0
      "movdqu      0x00(%0,%3,1),%%xmm2          \n"  // 8 UV row 1
      "lea         0x10(%0),%0                   \n"
      "pshufb      %%xmm1,%%xmm0                 \n"  // uuuuvvvv
      "pshufb      %%xmm1,%%xmm2                 \n"
      "pmaddubsw   %%xmm4,%%xmm0                 \n"  // horizontal add
      "pmaddubsw   %%xmm4,%%xmm2                 \n"
      "paddw       %%xmm2,%%xmm0                 \n"  // vertical add
      "psrlw       $0x1,%%xmm0                   \n"  // round
      "pavgw       %%xmm5,%%xmm0                 \n"
      "pshufb      %%xmm3,%%xmm0                 \n"  // merge uv
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"  // 4 UV
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),                // %0
        "+r"(dst_ptr),                // %1
        "+r"(dst_width)               // %2
      : "r"((intptr_t)(src_stride)),  // %3
        "m"(kShuffleSplitUV),         // %4
        "m"(kShuffleMergeUV)          // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}